

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O1

void __thiscall xLearn::Model::free_model(Model *this)

{
  free(this->param_w_);
  free(this->param_v_);
  free(this->param_b_);
  if (this->param_best_w_ != (real_t *)0x0) {
    free(this->param_best_w_);
  }
  if (this->param_best_v_ != (real_t *)0x0) {
    free(this->param_best_v_);
  }
  if (this->param_best_b_ != (real_t *)0x0) {
    free(this->param_best_b_);
    return;
  }
  return;
}

Assistant:

void Model::free_model() {
  free(param_w_);
#ifndef _MSC_VER
  free(param_v_);
#else
  _aligned_free(param_v_);
#endif
  free(param_b_);
  if (param_best_w_ != nullptr) {
    free(param_best_w_);
  }
  if (param_best_v_ != nullptr) {
#ifndef _MSC_VER
    free(param_best_v_);
#else
    _aligned_free(param_best_v_);
#endif
  }
  if (param_best_b_ != nullptr) {
    free(param_best_b_);
  }
}